

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

TIntermTyped * __thiscall
glslang::HlslParseContext::handleLvalue
          (HlslParseContext *this,TSourceLoc *loc,char *op,TIntermTyped **node)

{
  TOperator TVar1;
  TOperator op_00;
  TIntermediate *this_00;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  HlslParseContext *pHVar5;
  TIntermNode *node_00;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long *plVar6;
  long *plVar7;
  long lVar8;
  TIntermTyped *pTVar9;
  undefined4 extraout_var_05;
  TSampler *sampler;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  TIntermSymbol *lhs;
  TIntermSymbol *rhsTmp;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  TIntermSymbol *pTVar10;
  TIntermSymbol *pTVar11;
  TType *type;
  TIntermAggregate *pTVar12;
  long lVar13;
  TSourceLoc *pTVar14;
  long lVar15;
  HlslParseContext *this_01;
  long lVar16;
  int comp;
  uint uVar17;
  char *pcVar18;
  array<bool,_4UL> compIsSet;
  value_type_conflict local_171;
  TIntermTyped *local_170;
  TIntermSymbol *local_168;
  TSourceLoc *local_160;
  TIntermTyped *local_158;
  long *local_150;
  anon_class_24_3_9f5bceca makeBinary;
  anon_class_24_3_9f5bceca finishSequence;
  anon_class_24_3_d1780b14 makeStore;
  anon_class_24_3_c560d4ac makeLoad;
  TIntermAggregate *sequence;
  anon_class_24_3_9f5bceca makeUnary;
  TType objDerefType;
  HlslParseContext *pHVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  if (*node == (TIntermTyped *)0x0) {
    return (TIntermTyped *)0x0;
  }
  local_158 = (TIntermTyped *)op;
  iVar3 = (*((*node)->super_TIntermNode)._vptr_TIntermNode[8])();
  pHVar4 = (HlslParseContext *)CONCAT44(extraout_var,iVar3);
  this_01 = (HlslParseContext *)*node;
  iVar3 = (*(this_01->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[7])();
  pHVar5 = (HlslParseContext *)CONCAT44(extraout_var_00,iVar3);
  sequence = (TIntermAggregate *)0x0;
  if (pHVar5 == (HlslParseContext *)0x0) {
    if (pHVar4 == (HlslParseContext *)0x0) {
      node_00 = (TIntermNode *)0x0;
    }
    else {
      this_01 = pHVar4;
      iVar3 = (*(pHVar4->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x32])()
      ;
      node_00 = (TIntermNode *)CONCAT44(extraout_var_02,iVar3);
    }
  }
  else {
    this_01 = pHVar5;
    iVar3 = (*(pHVar5->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x31])();
    node_00 = (TIntermNode *)CONCAT44(extraout_var_01,iVar3);
  }
  bVar2 = shouldConvertLValue(this_01,node_00);
  if (bVar2) {
    makeBinary.sequence = &sequence;
    local_160 = loc;
    makeBinary.this = this;
    makeBinary.loc = loc;
    finishSequence.sequence = makeBinary.sequence;
    finishSequence.this = this;
    finishSequence.loc = loc;
    makeStore.this = this;
    makeStore.loc = loc;
    makeStore.sequence = makeBinary.sequence;
    makeLoad.loc = loc;
    makeLoad.this = this;
    makeLoad.sequence = makeBinary.sequence;
    makeUnary.sequence = makeBinary.sequence;
    makeUnary.this = this;
    makeUnary.loc = loc;
    iVar3 = (*node_00->_vptr_TIntermNode[8])(node_00);
    plVar6 = (long *)CONCAT44(extraout_var_03,iVar3);
    iVar3 = (*node_00->_vptr_TIntermNode[6])(node_00);
    plVar7 = (long *)CONCAT44(extraout_var_04,iVar3);
    local_150 = plVar6;
    if ((plVar6 == (long *)0x0) || (((int)plVar6[0x17] != 0x36 && ((int)plVar6[0x17] != 0x33)))) {
      bVar2 = false;
    }
    else {
      plVar6 = (long *)(**(code **)(*plVar6 + 400))();
      plVar7 = (long *)(**(code **)(*plVar6 + 0x30))(plVar6);
      bVar2 = true;
    }
    lVar8 = (**(code **)(*plVar7 + 400))(plVar7);
    pTVar9 = (TIntermTyped *)(**(code **)(*(long *)**(undefined8 **)(lVar8 + 8) + 0x18))();
    lVar8 = (**(code **)(*plVar7 + 400))(plVar7);
    local_168 = (TIntermSymbol *)(**(code **)(**(long **)(*(long *)(lVar8 + 8) + 8) + 0x18))();
    local_170 = pTVar9;
    iVar3 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar9);
    sampler = (TSampler *)
              (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar3) + 0x40))
                        ((long *)CONCAT44(extraout_var_05,iVar3));
    TType::TType(&objDerefType,EbtVoid,EvqTemporary,1,0,0,false);
    getTextureReturnType(this,sampler,&objDerefType);
    if (pHVar4 == (HlslParseContext *)0x0) {
LAB_00386238:
      pTVar14 = local_160;
      loc = local_160;
      if (pHVar5 == (HlslParseContext *)0x0) {
LAB_00386324:
        iVar3 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x42])
                          (this,loc,local_158,node_00);
        if ((char)iVar3 != '\0') {
          return (TIntermTyped *)0x0;
        }
        goto LAB_00386346;
      }
      TVar1 = *(TOperator *)
               &(pHVar5->super_TParseContextBase).super_TParseVersions.spvUnsupportedExt.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (TVar1 - EOpPostIncrement < 2) {
        rhsTmp = makeInternalVariableNode(this,local_160,"storeTempPre",&objDerefType);
        pTVar10 = makeInternalVariableNode(this,pTVar14,"storeTempPost",&objDerefType);
        pTVar11 = local_168;
        iVar3 = (*(local_168->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                          (local_168);
        lhs = makeInternalVariableNode
                        (this,pTVar14,"coordTemp",(TType *)CONCAT44(extraout_var_09,iVar3));
        handleLvalue::anon_class_24_3_9f5bceca::operator()
                  (&makeBinary,EOpAssign,&lhs->super_TIntermTyped,&pTVar11->super_TIntermTyped);
        pTVar9 = local_170;
        handleLvalue::anon_class_24_3_c560d4ac::operator()
                  (&makeLoad,rhsTmp,local_170,&lhs->super_TIntermTyped,&objDerefType);
        handleLvalue::anon_class_24_3_9f5bceca::operator()
                  (&makeBinary,EOpAssign,&pTVar10->super_TIntermTyped,&rhsTmp->super_TIntermTyped);
        handleLvalue::anon_class_24_3_9f5bceca::operator()(&makeUnary,TVar1,pTVar10);
        handleLvalue::anon_class_24_3_d1780b14::operator()
                  (&makeStore,pTVar9,&lhs->super_TIntermTyped,pTVar10);
      }
      else {
        if (1 < TVar1 - EOpPreIncrement) goto LAB_00386324;
        rhsTmp = makeInternalVariableNode(this,local_160,"storeTemp",&objDerefType);
        pTVar11 = local_168;
        iVar3 = (*(local_168->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                          (local_168);
        pTVar10 = makeInternalVariableNode
                            (this,pTVar14,"coordTemp",(TType *)CONCAT44(extraout_var_08,iVar3));
        handleLvalue::anon_class_24_3_9f5bceca::operator()
                  (&makeBinary,EOpAssign,&pTVar10->super_TIntermTyped,&pTVar11->super_TIntermTyped);
        pTVar9 = local_170;
        handleLvalue::anon_class_24_3_c560d4ac::operator()
                  (&makeLoad,rhsTmp,local_170,&pTVar10->super_TIntermTyped,&objDerefType);
        handleLvalue::anon_class_24_3_9f5bceca::operator()(&makeUnary,TVar1,rhsTmp);
        handleLvalue::anon_class_24_3_d1780b14::operator()
                  (&makeStore,pTVar9,&pTVar10->super_TIntermTyped,rhsTmp);
      }
    }
    else {
      iVar3 = (*(pHVar4->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x33])
                        (pHVar4);
      pTVar9 = (TIntermTyped *)CONCAT44(extraout_var_06,iVar3);
      TVar1 = *(TOperator *)
               &(pHVar4->super_TParseContextBase).super_TParseVersions.spvUnsupportedExt.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar17 = TVar1 - EOpAssign;
      if (0xe < uVar17) goto LAB_00386238;
      uVar17 = 0x7ffe >> ((byte)uVar17 & 0x1f);
      local_158 = pTVar9;
      iVar3 = (*(pTVar9->super_TIntermNode)._vptr_TIntermNode[0xc])(pTVar9);
      pTVar14 = local_160;
      rhsTmp = (TIntermSymbol *)CONCAT44(extraout_var_07,iVar3);
      if ((bVar2 || rhsTmp == (TIntermSymbol *)0x0) || (pTVar9 = local_170, (uVar17 & 1) != 0)) {
        rhsTmp = makeInternalVariableNode(this,local_160,"storeTemp",&objDerefType);
        if (local_150 != (long *)0x0) {
          local_171 = false;
          std::array<bool,_4UL>::fill(&compIsSet,&local_171);
          plVar6 = local_150;
          plVar7 = (long *)(**(code **)(*local_150 + 0x198))(local_150);
          lVar8 = (**(code **)(*plVar7 + 0x28))(plVar7);
          plVar6 = (long *)(**(code **)(*plVar6 + 0x198))(plVar6);
          plVar6 = (long *)(**(code **)(*plVar6 + 0x30))(plVar6);
          if (lVar8 == 0) {
            if (plVar6 == (long *)0x0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                            ,0x15b,
                            "auto glslang::HlslParseContext::handleLvalue(const TSourceLoc &, const char *, TIntermTyped *&)::(anonymous class)::operator()(TIntermSymbol *, TIntermBinary *) const"
                           );
            }
            lVar8 = (**(code **)(*plVar6 + 0x198))(plVar6);
            for (lVar13 = 0;
                lVar13 < (int)((ulong)(*(long *)(lVar8 + 0x10) - *(long *)(lVar8 + 8)) >> 3);
                lVar13 = lVar13 + 1) {
              lVar15 = (**(code **)(**(long **)(*(long *)(lVar8 + 8) + lVar13 * 8) + 0x28))();
              compIsSet._M_elems[**(int **)(*(long *)(lVar15 + 0xc0) + 8)] = true;
            }
          }
          else {
            compIsSet._M_elems[**(int **)(*(long *)(lVar8 + 0xc0) + 8)] = true;
          }
          iVar3 = (*(rhsTmp->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(rhsTmp);
          iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar3) + 0x60))
                            ((long *)CONCAT44(extraout_var_10,iVar3));
          pTVar14 = local_160;
          lVar13 = (long)iVar3;
          lVar15 = 0;
          lVar8 = 0;
          for (lVar16 = lVar13 >> 2; 0 < lVar16; lVar16 = lVar16 + -1) {
            if ((&compIsSet)[lVar15]._M_elems[0] != true) {
              pcVar18 = (char *)((long)&compIsSet - lVar8);
              goto LAB_003865ec;
            }
            if ((&compIsSet)[lVar15]._M_elems[1] != true) {
              pcVar18 = (char *)((long)&compIsSet + (1 - lVar8));
              goto LAB_003865ec;
            }
            if ((&compIsSet)[lVar15]._M_elems[2] != true) {
              pcVar18 = (char *)((long)&compIsSet + (2 - lVar8));
              goto LAB_003865ec;
            }
            if ((&compIsSet)[lVar15]._M_elems[3] != true) {
              pcVar18 = (char *)((long)&compIsSet + (3 - lVar8));
              goto LAB_003865ec;
            }
            lVar8 = lVar8 + -4;
            lVar15 = lVar15 + 1;
          }
          pcVar18 = (char *)((long)&compIsSet - lVar8);
          lVar16 = lVar13 + lVar8;
          if (lVar16 == 1) {
LAB_00386774:
            if (*pcVar18 == '\x01') goto LAB_00386616;
          }
          else if (lVar16 == 3) {
            if ((&compIsSet)[lVar15]._M_elems[0] == true) {
              pcVar18 = (char *)((long)&compIsSet + (1 - lVar8));
              goto LAB_00386768;
            }
          }
          else {
            if (lVar16 != 2) goto LAB_00386616;
LAB_00386768:
            if (*pcVar18 == '\x01') {
              pcVar18 = pcVar18 + 1;
              goto LAB_00386774;
            }
          }
LAB_003865ec:
          if ((bool *)pcVar18 != compIsSet._M_elems + lVar13) {
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,local_160,"unimplemented: partial image updates","","");
          }
        }
LAB_00386616:
        pTVar11 = local_168;
        if ((uVar17 & 1) != 0) {
          iVar3 = (*(local_168->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                            (local_168);
          pTVar10 = makeInternalVariableNode
                              (this,pTVar14,"coordTemp",(TType *)CONCAT44(extraout_var_11,iVar3));
          handleLvalue::anon_class_24_3_9f5bceca::operator()
                    (&makeBinary,EOpAssign,&pTVar10->super_TIntermTyped,&pTVar11->super_TIntermTyped
                    );
          handleLvalue::anon_class_24_3_c560d4ac::operator()
                    (&makeLoad,rhsTmp,local_170,&pTVar10->super_TIntermTyped,&objDerefType);
          local_168 = pTVar10;
        }
        pTVar11 = TIntermediate::addSymbol
                            ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                             rhsTmp);
        plVar6 = local_150;
        if (local_150 != (long *)0x0) {
          this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
          op_00 = *(TOperator *)(local_150 + 0x17);
          pTVar9 = (TIntermTyped *)(**(code **)(*local_150 + 0x198))(local_150);
          type = (TType *)(**(code **)(*plVar6 + 0xf0))(plVar6);
          pTVar11 = (TIntermSymbol *)
                    TIntermediate::addBinaryNode
                              (this_00,op_00,&pTVar11->super_TIntermTyped,pTVar9,local_160,type);
        }
        pTVar9 = local_170;
        handleLvalue::anon_class_24_3_9f5bceca::operator()
                  (&makeBinary,TVar1,&pTVar11->super_TIntermTyped,local_158);
      }
      handleLvalue::anon_class_24_3_d1780b14::operator()
                (&makeStore,pTVar9,&local_168->super_TIntermTyped,rhsTmp);
    }
    pTVar12 = handleLvalue::anon_class_24_3_9f5bceca::operator()
                        (&finishSequence,rhsTmp,&objDerefType);
  }
  else {
    if (node_00 != (TIntermNode *)0x0) goto LAB_00386324;
LAB_00386346:
    pTVar12 = (TIntermAggregate *)*node;
  }
  return (TIntermTyped *)pTVar12;
}

Assistant:

TIntermTyped* HlslParseContext::handleLvalue(const TSourceLoc& loc, const char* op, TIntermTyped*& node)
{
    if (node == nullptr)
        return nullptr;

    TIntermBinary* nodeAsBinary = node->getAsBinaryNode();
    TIntermUnary* nodeAsUnary = node->getAsUnaryNode();
    TIntermAggregate* sequence = nullptr;

    TIntermTyped* lhs = nodeAsUnary  ? nodeAsUnary->getOperand() :
                        nodeAsBinary ? nodeAsBinary->getLeft() :
                        nullptr;

    // Early bail out if there is no conversion to apply
    if (!shouldConvertLValue(lhs)) {
        if (lhs != nullptr)
            if (lValueErrorCheck(loc, op, lhs))
                return nullptr;
        return node;
    }

    // *** If we get here, we're going to apply some conversion to an l-value.

    // Helper to create a load.
    const auto makeLoad = [&](TIntermSymbol* rhsTmp, TIntermTyped* object, TIntermTyped* coord, const TType& derefType) {
        TIntermAggregate* loadOp = new TIntermAggregate(EOpImageLoad);
        loadOp->setLoc(loc);
        loadOp->getSequence().push_back(object);
        loadOp->getSequence().push_back(intermediate.addSymbol(*coord->getAsSymbolNode()));
        loadOp->setType(derefType);

        sequence = intermediate.growAggregate(sequence,
                                              intermediate.addAssign(EOpAssign, rhsTmp, loadOp, loc),
                                              loc);
    };

    // Helper to create a store.
    const auto makeStore = [&](TIntermTyped* object, TIntermTyped* coord, TIntermSymbol* rhsTmp) {
        TIntermAggregate* storeOp = new TIntermAggregate(EOpImageStore);
        storeOp->getSequence().push_back(object);
        storeOp->getSequence().push_back(coord);
        storeOp->getSequence().push_back(intermediate.addSymbol(*rhsTmp));
        storeOp->setLoc(loc);
        storeOp->setType(TType(EbtVoid));

        sequence = intermediate.growAggregate(sequence, storeOp);
    };

    // Helper to create an assign.
    const auto makeBinary = [&](TOperator op, TIntermTyped* lhs, TIntermTyped* rhs) {
        sequence = intermediate.growAggregate(sequence,
                                              intermediate.addBinaryNode(op, lhs, rhs, loc, lhs->getType()),
                                              loc);
    };

    // Helper to complete sequence by adding trailing variable, so we evaluate to the right value.
    const auto finishSequence = [&](TIntermSymbol* rhsTmp, const TType& derefType) -> TIntermAggregate* {
        // Add a trailing use of the temp, so the sequence returns the proper value.
        sequence = intermediate.growAggregate(sequence, intermediate.addSymbol(*rhsTmp));
        sequence->setOperator(EOpSequence);
        sequence->setLoc(loc);
        sequence->setType(derefType);

        return sequence;
    };

    // Helper to add unary op
    const auto makeUnary = [&](TOperator op, TIntermSymbol* rhsTmp) {
        sequence = intermediate.growAggregate(sequence,
                                              intermediate.addUnaryNode(op, intermediate.addSymbol(*rhsTmp), loc,
                                                                        rhsTmp->getType()),
                                              loc);
    };

    // Return true if swizzle or index writes all components of the given variable.
    const auto writesAllComponents = [&](TIntermSymbol* var, TIntermBinary* swizzle) -> bool {
        if (swizzle == nullptr)  // not a swizzle or index
            return true;

        // Track which components are being set.
        std::array<bool, 4> compIsSet;
        compIsSet.fill(false);

        const TIntermConstantUnion* asConst     = swizzle->getRight()->getAsConstantUnion();
        const TIntermAggregate*     asAggregate = swizzle->getRight()->getAsAggregate();

        // This could be either a direct index, or a swizzle.
        if (asConst) {
            compIsSet[asConst->getConstArray()[0].getIConst()] = true;
        } else if (asAggregate) {
            const TIntermSequence& seq = asAggregate->getSequence();
            for (int comp=0; comp<int(seq.size()); ++comp)
                compIsSet[seq[comp]->getAsConstantUnion()->getConstArray()[0].getIConst()] = true;
        } else {
            assert(0);
        }

        // Return true if all components are being set by the index or swizzle
        return std::all_of(compIsSet.begin(), compIsSet.begin() + var->getType().getVectorSize(),
                           [](bool isSet) { return isSet; } );
    };

    // Create swizzle matching input swizzle
    const auto addSwizzle = [&](TIntermSymbol* var, TIntermBinary* swizzle) -> TIntermTyped* {
        if (swizzle)
            return intermediate.addBinaryNode(swizzle->getOp(), var, swizzle->getRight(), loc, swizzle->getType());
        else
            return var;
    };

    TIntermBinary*    lhsAsBinary    = lhs->getAsBinaryNode();
    TIntermAggregate* lhsAsAggregate = lhs->getAsAggregate();
    bool lhsIsSwizzle = false;

    // If it's a swizzled L-value, remember the swizzle, and use the LHS.
    if (lhsAsBinary != nullptr && (lhsAsBinary->getOp() == EOpVectorSwizzle || lhsAsBinary->getOp() == EOpIndexDirect)) {
        lhsAsAggregate = lhsAsBinary->getLeft()->getAsAggregate();
        lhsIsSwizzle = true;
    }

    TIntermTyped* object = lhsAsAggregate->getSequence()[0]->getAsTyped();
    TIntermTyped* coord  = lhsAsAggregate->getSequence()[1]->getAsTyped();

    const TSampler& texSampler = object->getType().getSampler();

    TType objDerefType;
    getTextureReturnType(texSampler, objDerefType);

    if (nodeAsBinary) {
        TIntermTyped* rhs = nodeAsBinary->getRight();
        const TOperator assignOp = nodeAsBinary->getOp();

        bool isModifyOp = false;

        switch (assignOp) {
        case EOpAddAssign:
        case EOpSubAssign:
        case EOpMulAssign:
        case EOpVectorTimesMatrixAssign:
        case EOpVectorTimesScalarAssign:
        case EOpMatrixTimesScalarAssign:
        case EOpMatrixTimesMatrixAssign:
        case EOpDivAssign:
        case EOpModAssign:
        case EOpAndAssign:
        case EOpInclusiveOrAssign:
        case EOpExclusiveOrAssign:
        case EOpLeftShiftAssign:
        case EOpRightShiftAssign:
            isModifyOp = true;
            [[fallthrough]];
        case EOpAssign:
            {
                // Since this is an lvalue, we'll convert an image load to a sequence like this
                // (to still provide the value):
                //   OpSequence
                //      OpImageStore(object, lhs, rhs)
                //      rhs
                // But if it's not a simple symbol RHS (say, a fn call), we don't want to duplicate the RHS,
                // so we'll convert instead to this:
                //   OpSequence
                //      rhsTmp = rhs
                //      OpImageStore(object, coord, rhsTmp)
                //      rhsTmp
                // If this is a read-modify-write op, like +=, we issue:
                //   OpSequence
                //      coordtmp = load's param1
                //      rhsTmp = OpImageLoad(object, coordTmp)
                //      rhsTmp op= rhs
                //      OpImageStore(object, coordTmp, rhsTmp)
                //      rhsTmp
                //
                // If the lvalue is swizzled, we apply that when writing the temp variable, like so:
                //    ...
                //    rhsTmp.some_swizzle = ...
                // For partial writes, an error is generated.

                TIntermSymbol* rhsTmp = rhs->getAsSymbolNode();
                TIntermTyped* coordTmp = coord;

                if (rhsTmp == nullptr || isModifyOp || lhsIsSwizzle) {
                    rhsTmp = makeInternalVariableNode(loc, "storeTemp", objDerefType);

                    // Partial updates not yet supported
                    if (!writesAllComponents(rhsTmp, lhsAsBinary)) {
                        error(loc, "unimplemented: partial image updates", "", "");
                    }

                    // Assign storeTemp = rhs
                    if (isModifyOp) {
                        // We have to make a temp var for the coordinate, to avoid evaluating it twice.
                        coordTmp = makeInternalVariableNode(loc, "coordTemp", coord->getType());
                        makeBinary(EOpAssign, coordTmp, coord); // coordtmp = load[param1]
                        makeLoad(rhsTmp, object, coordTmp, objDerefType); // rhsTmp = OpImageLoad(object, coordTmp)
                    }

                    // rhsTmp op= rhs.
                    makeBinary(assignOp, addSwizzle(intermediate.addSymbol(*rhsTmp), lhsAsBinary), rhs);
                }

                makeStore(object, coordTmp, rhsTmp);         // add a store
                return finishSequence(rhsTmp, objDerefType); // return rhsTmp from sequence
            }

        default:
            break;
        }
    }

    if (nodeAsUnary) {
        const TOperator assignOp = nodeAsUnary->getOp();

        switch (assignOp) {
        case EOpPreIncrement:
        case EOpPreDecrement:
            {
                // We turn this into:
                //   OpSequence
                //      coordtmp = load's param1
                //      rhsTmp = OpImageLoad(object, coordTmp)
                //      rhsTmp op
                //      OpImageStore(object, coordTmp, rhsTmp)
                //      rhsTmp

                TIntermSymbol* rhsTmp = makeInternalVariableNode(loc, "storeTemp", objDerefType);
                TIntermTyped* coordTmp = makeInternalVariableNode(loc, "coordTemp", coord->getType());

                makeBinary(EOpAssign, coordTmp, coord);           // coordtmp = load[param1]
                makeLoad(rhsTmp, object, coordTmp, objDerefType); // rhsTmp = OpImageLoad(object, coordTmp)
                makeUnary(assignOp, rhsTmp);                      // op rhsTmp
                makeStore(object, coordTmp, rhsTmp);              // OpImageStore(object, coordTmp, rhsTmp)
                return finishSequence(rhsTmp, objDerefType);      // return rhsTmp from sequence
            }

        case EOpPostIncrement:
        case EOpPostDecrement:
            {
                // We turn this into:
                //   OpSequence
                //      coordtmp = load's param1
                //      rhsTmp1 = OpImageLoad(object, coordTmp)
                //      rhsTmp2 = rhsTmp1
                //      rhsTmp2 op
                //      OpImageStore(object, coordTmp, rhsTmp2)
                //      rhsTmp1 (pre-op value)
                TIntermSymbol* rhsTmp1 = makeInternalVariableNode(loc, "storeTempPre",  objDerefType);
                TIntermSymbol* rhsTmp2 = makeInternalVariableNode(loc, "storeTempPost", objDerefType);
                TIntermTyped* coordTmp = makeInternalVariableNode(loc, "coordTemp", coord->getType());

                makeBinary(EOpAssign, coordTmp, coord);            // coordtmp = load[param1]
                makeLoad(rhsTmp1, object, coordTmp, objDerefType); // rhsTmp1 = OpImageLoad(object, coordTmp)
                makeBinary(EOpAssign, rhsTmp2, rhsTmp1);           // rhsTmp2 = rhsTmp1
                makeUnary(assignOp, rhsTmp2);                      // rhsTmp op
                makeStore(object, coordTmp, rhsTmp2);              // OpImageStore(object, coordTmp, rhsTmp2)
                return finishSequence(rhsTmp1, objDerefType);      // return rhsTmp from sequence
            }

        default:
            break;
        }
    }

    if (lhs)
        if (lValueErrorCheck(loc, op, lhs))
            return nullptr;

    return node;
}